

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O2

void __thiscall Fl_File_Chooser::remove_hidden_files(Fl_File_Chooser *this)

{
  int iVar1;
  char *__s1;
  int num;
  uint line;
  
  for (line = (this->fileList->super_Fl_Browser).lines; 0 < (int)line; line = line - 1) {
    __s1 = Fl_Browser::text(&this->fileList->super_Fl_Browser,line);
    if (*__s1 == '.') {
      iVar1 = strcmp(__s1,"../");
      if (iVar1 != 0) {
        Fl_Browser::remove(&this->fileList->super_Fl_Browser,(char *)(ulong)line);
      }
    }
  }
  Fl_Browser::topline(&this->fileList->super_Fl_Browser,1);
  return;
}

Assistant:

void Fl_File_Chooser::remove_hidden_files()
{
  int count = fileList->size();
  for(int num = count; num >= 1; num--) {
    const char *p = fileList->text(num);
    if (*p == '.' && strcmp(p, "../") != 0) fileList->remove(num);
  }
  fileList->topline(1);
}